

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O2

char * mp_encode_array(char *data,uint32_t size)

{
  long lStack_8;
  
  if (size < 0x10) {
    *data = (byte)size | 0x90;
    lStack_8 = 1;
  }
  else if (size < 0x10000) {
    *data = -0x24;
    *(ushort *)(data + 1) = (ushort)size << 8 | (ushort)size >> 8;
    lStack_8 = 3;
  }
  else {
    *data = -0x23;
    *(uint32_t *)(data + 1) =
         size >> 0x18 | (size & 0xff0000) >> 8 | (size & 0xff00) << 8 | size << 0x18;
    lStack_8 = 5;
  }
  return data + lStack_8;
}

Assistant:

MP_IMPL char *
mp_encode_array(char *data, uint32_t size)
{
	if (size <= 15) {
		return mp_store_u8(data, 0x90 | size);
	} else if (size <= UINT16_MAX) {
		data = mp_store_u8(data, 0xdc);
		data = mp_store_u16(data, size);
		return data;
	} else {
		data = mp_store_u8(data, 0xdd);
		return mp_store_u32(data, size);
	}
}